

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

size_t __thiscall
proto2_unittest::TestAllTypesLite_RepeatedGroup::ByteSizeLong(TestAllTypesLite_RepeatedGroup *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  
  if ((undefined1  [12])((undefined1  [12])this->field_0 & (undefined1  [12])0x1) ==
      (undefined1  [12])0x0) {
    sVar3 = 0;
  }
  else {
    uVar2 = (long)(this->field_0)._impl_.a_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 2;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar2 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar3 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar3;
  }
  return sVar3;
}

Assistant:

::size_t TestAllTypesLite_RepeatedGroup::ByteSizeLong() const {
  const TestAllTypesLite_RepeatedGroup& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestAllTypesLite.RepeatedGroup)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // int32 a = 47;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_a());
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}